

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_uint0.c
# Opt level: O2

uint fmt_uint0(char *s,uint u,uint n)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = fmt_uint((char *)0x0,u);
  for (uVar2 = uVar1; uVar2 < n; uVar2 = uVar2 + 1) {
    if (s == (char *)0x0) {
      s = (char *)0x0;
    }
    else {
      *s = '0';
      s = s + 1;
    }
  }
  if (s != (char *)0x0) {
    fmt_uint(s,u);
  }
  if (n < uVar1) {
    n = uVar1;
  }
  return n;
}

Assistant:

unsigned int fmt_uint0(char *s,unsigned int u,unsigned int n)
{
  unsigned int len;
  len = fmt_uint(FMT_LEN,u);
  while (len < n) { if (s) *s++ = '0'; ++len; }
  if (s) fmt_uint(s,u);
  return len;
}